

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O1

void ImVector_ImFontGlyph_resizeT(ImVector_ImFontGlyph *self,int new_size,ImFontGlyph v)

{
  undefined8 *puVar1;
  int iVar2;
  ImFontGlyph *pIVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  iVar2 = self->Capacity;
  if (iVar2 < new_size) {
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    if (iVar6 <= new_size) {
      iVar6 = new_size;
    }
    if (iVar2 < iVar6) {
      pIVar3 = (ImFontGlyph *)ImGui::MemAlloc((long)iVar6 * 0x28);
      if (self->Data != (ImFontGlyph *)0x0) {
        memcpy(pIVar3,self->Data,(long)self->Size * 0x28);
        ImGui::MemFree(self->Data);
      }
      self->Data = pIVar3;
      self->Capacity = iVar6;
    }
  }
  iVar2 = self->Size;
  if (iVar2 < new_size) {
    lVar4 = (long)new_size - (long)iVar2;
    lVar5 = (long)iVar2 * 0x28;
    do {
      pIVar3 = self->Data;
      *(undefined8 *)((long)&pIVar3->U1 + lVar5) = v._32_8_;
      puVar1 = (undefined8 *)((long)&pIVar3->X1 + lVar5);
      *puVar1 = v._16_8_;
      puVar1[1] = v._24_8_;
      puVar1 = (undefined8 *)((long)&pIVar3->Codepoint + lVar5);
      *puVar1 = v._0_8_;
      puVar1[1] = v._8_8_;
      lVar5 = lVar5 + 0x28;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  self->Size = new_size;
  return;
}

Assistant:

CIMGUI_API void ImVector_ImFontGlyph_resizeT(ImVector_ImFontGlyph* self,int new_size,const ImFontGlyph v)
{
    return self->resize(new_size,v);
}